

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTrivial(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Return *pRVar2;
  Expression *value;
  ulong extraout_RDX;
  Type type_00;
  uint32_t x;
  
  this->trivialNesting = this->trivialNesting + 1;
  if (type.id < 2) {
    if (type.id == 0) {
      pRVar2 = (Return *)makeNop(this,(Type)0x0);
    }
    else {
      wasm::HeapType::getSignature();
      if (extraout_RDX < 2) {
        value = (Expression *)0x0;
      }
      else {
        wasm::HeapType::getSignature();
        value = makeTrivial(this,type_00);
      }
      pRVar2 = Builder::makeReturn(&this->builder,value);
    }
  }
  else {
    if (this->funcContext != (FunctionCreationContext *)0x0) {
      x = 2;
      if (6 < type.id) {
        x = (uint)((type.id & 3) == 0) * 8 + 2;
      }
      bVar1 = Random::oneIn(&this->random,x);
      if (bVar1) {
        pRVar2 = (Return *)makeLocalGet(this,type);
        goto LAB_0013baa0;
      }
    }
    bVar1 = Random::oneIn(&this->random,2);
    if (bVar1) {
      pRVar2 = (Return *)makeConst(this,type);
    }
    else {
      pRVar2 = (Return *)makeGlobalGet(this,type);
    }
  }
LAB_0013baa0:
  this->trivialNesting = this->trivialNesting + -1;
  return (Expression *)pRVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeTrivial(Type type) {
  struct TrivialNester {
    TranslateToFuzzReader& parent;
    TrivialNester(TranslateToFuzzReader& parent) : parent(parent) {
      parent.trivialNesting++;
    }
    ~TrivialNester() { parent.trivialNesting--; }
  } nester(*this);

  if (type.isConcrete()) {
    // If we have a function context, use a local half the time. Use a local
    // less often if the local is non-nullable, however, as then we might be
    // using it before it was set, which would trap.
    if (funcContext && oneIn(type.isNonNullable() ? 10 : 2)) {
      return makeLocalGet(type);
    }

    // Either make a const, or a global.get (which may fail to find a suitable
    // global, especially in a non-function context, and if so it will make a
    // constant instead).
    return oneIn(2) ? makeConst(type) : makeGlobalGet(type);
  } else if (type == Type::none) {
    return makeNop(type);
  }
  assert(type == Type::unreachable);
  Expression* ret = nullptr;
  if (funcContext->func->getResults().isConcrete()) {
    ret = makeTrivial(funcContext->func->getResults());
  }
  return builder.makeReturn(ret);
}